

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall
spirv_cross::Compiler::CFGBuilder::follow_function_call(CFGBuilder *this,SPIRFunction *func)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  CFG *__ptr;
  default_delete<spirv_cross::CFG> *this_00;
  CFG *this_01;
  __hash_code __code;
  ulong uVar3;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  bool bVar6;
  uint local_2c;
  
  local_2c = (func->super_IVariant).self.id;
  uVar1 = (this->function_cfgs)._M_h._M_bucket_count;
  uVar3 = (ulong)local_2c % uVar1;
  p_Var4 = (this->function_cfgs)._M_h._M_buckets[uVar3];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var4->_M_nxt, p_Var5 = p_Var4, local_2c != *(uint *)&p_Var4->_M_nxt[1]._M_nxt)) {
    while (p_Var4 = p_Var2, p_Var2 = p_Var4->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var2[1]._M_nxt % uVar1 != uVar3) ||
         (p_Var5 = p_Var4, local_2c == *(uint *)&p_Var2[1]._M_nxt)) goto LAB_002cdeca;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_002cdeca:
  if (p_Var5 == (__node_base_ptr)0x0) {
    bVar6 = true;
  }
  else {
    bVar6 = p_Var5->_M_nxt == (_Hash_node_base *)0x0;
  }
  if (bVar6 != false) {
    this_00 = (default_delete<spirv_cross::CFG> *)
              ::std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->function_cfgs,&local_2c);
    this_01 = (CFG *)operator_new(0x168);
    CFG::CFG(this_01,this->compiler,func);
    __ptr = *(CFG **)this_00;
    *(CFG **)this_00 = this_01;
    if (__ptr != (CFG *)0x0) {
      ::std::default_delete<spirv_cross::CFG>::operator()(this_00,__ptr);
    }
  }
  return bVar6;
}

Assistant:

bool Compiler::CFGBuilder::follow_function_call(const SPIRFunction &func)
{
	if (function_cfgs.find(func.self) == end(function_cfgs))
	{
		function_cfgs[func.self].reset(new CFG(compiler, func));
		return true;
	}
	else
		return false;
}